

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O0

FlagValue * __thiscall google::anon_unknown_1::FlagValue::New(FlagValue *this)

{
  char *type_00;
  undefined1 *valbuf;
  undefined4 *puVar1;
  undefined8 *puVar2;
  string *this_00;
  char *type;
  FlagValue *this_local;
  
  type_00 = TypeName(this);
  switch(this->type_) {
  case '\0':
    this_local = (FlagValue *)operator_new(0x10);
    valbuf = (undefined1 *)operator_new(1);
    *valbuf = 0;
    FlagValue(this_local,valbuf,type_00,true);
    break;
  case '\x01':
    this_local = (FlagValue *)operator_new(0x10);
    puVar1 = (undefined4 *)operator_new(4);
    *puVar1 = 0;
    FlagValue(this_local,puVar1,type_00,true);
    break;
  case '\x02':
    this_local = (FlagValue *)operator_new(0x10);
    puVar1 = (undefined4 *)operator_new(4);
    *puVar1 = 0;
    FlagValue(this_local,puVar1,type_00,true);
    break;
  case '\x03':
    this_local = (FlagValue *)operator_new(0x10);
    puVar2 = (undefined8 *)operator_new(8);
    *puVar2 = 0;
    FlagValue(this_local,puVar2,type_00,true);
    break;
  case '\x04':
    this_local = (FlagValue *)operator_new(0x10);
    puVar2 = (undefined8 *)operator_new(8);
    *puVar2 = 0;
    FlagValue(this_local,puVar2,type_00,true);
    break;
  case '\x05':
    this_local = (FlagValue *)operator_new(0x10);
    puVar2 = (undefined8 *)operator_new(8);
    *puVar2 = 0;
    FlagValue(this_local,puVar2,type_00,true);
    break;
  case '\x06':
    this_local = (FlagValue *)operator_new(0x10);
    this_00 = (string *)operator_new(0x20);
    std::__cxx11::string::string(this_00);
    FlagValue(this_local,this_00,type_00,true);
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/gflags/src/gflags.cc"
                  ,0x1c2,"FlagValue *google::(anonymous namespace)::FlagValue::New() const");
  }
  return this_local;
}

Assistant:

FlagValue* FlagValue::New() const {
  const char *type = TypeName();
  switch (type_) {
    case FV_BOOL:   return new FlagValue(new bool(false), type, true);
    case FV_INT32:  return new FlagValue(new int32(0), type, true);
    case FV_UINT32: return new FlagValue(new uint32(0), type, true);
    case FV_INT64:  return new FlagValue(new int64(0), type, true);
    case FV_UINT64: return new FlagValue(new uint64(0), type, true);
    case FV_DOUBLE: return new FlagValue(new double(0.0), type, true);
    case FV_STRING: return new FlagValue(new string, type, true);
    default: assert(false); return NULL;  // unknown type
  }
}